

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t zesGetFirmwareProcAddrTable(ze_api_version_t version,zes_firmware_dditable_t *pDdiTable)

{
  zes_pfnFirmwareFlash_t p_Var1;
  zes_pfnFirmwareGetConsoleLogs_t p_Var2;
  ze_api_version_t *pzVar3;
  ze_result_t zVar4;
  
  pzVar3 = validation_layer::context;
  if (pDdiTable == (zes_firmware_dditable_t *)0x0) {
    zVar4 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar4 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnFlash;
      *(zes_pfnFirmwareGetProperties_t *)(validation_layer::context + 0x2e6) =
           pDdiTable->pfnGetProperties;
      *(zes_pfnFirmwareFlash_t *)(pzVar3 + 0x2e8) = p_Var1;
      pDdiTable->pfnGetProperties = validation_layer::zesFirmwareGetProperties;
      pDdiTable->pfnFlash = validation_layer::zesFirmwareFlash;
      p_Var2 = pDdiTable->pfnGetConsoleLogs;
      *(zes_pfnFirmwareGetFlashProgress_t *)(pzVar3 + 0x2ea) = pDdiTable->pfnGetFlashProgress;
      *(zes_pfnFirmwareGetConsoleLogs_t *)(pzVar3 + 0x2ec) = p_Var2;
      pDdiTable->pfnGetFlashProgress = validation_layer::zesFirmwareGetFlashProgress;
      pDdiTable->pfnGetConsoleLogs = validation_layer::zesFirmwareGetConsoleLogs;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar4;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetFirmwareProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_firmware_dditable_t* pDdiTable              ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zesDdiTable.Firmware;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = validation_layer::zesFirmwareGetProperties;

    dditable.pfnFlash                                    = pDdiTable->pfnFlash;
    pDdiTable->pfnFlash                                  = validation_layer::zesFirmwareFlash;

    dditable.pfnGetFlashProgress                         = pDdiTable->pfnGetFlashProgress;
    pDdiTable->pfnGetFlashProgress                       = validation_layer::zesFirmwareGetFlashProgress;

    dditable.pfnGetConsoleLogs                           = pDdiTable->pfnGetConsoleLogs;
    pDdiTable->pfnGetConsoleLogs                         = validation_layer::zesFirmwareGetConsoleLogs;

    return result;
}